

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,unsigned_long>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
::emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,unsigned_long>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
           *this,size_t i,piecewise_construct_t *args,tuple<const_unsigned_long_&> *args_1,
          tuple<> *args_2)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  long lVar4;
  iterator iVar5;
  
  lVar1 = *(long *)(this + 8);
  lVar4 = i * 0x10;
  uVar2 = *(args_1->super__Tuple_impl<0UL,_const_unsigned_long_&>).
           super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl;
  *(ulong *)(lVar1 + lVar4) = uVar2;
  *(undefined8 *)(lVar1 + 8 + lVar4) = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar2;
  iVar5 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      *)this,(key_arg<unsigned_long> *)(lVar1 + lVar4),
                     SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),8) +
                     SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),0));
  if (iVar5.ctrl_ == (ctrl_t *)(i + *(long *)this)) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) == iterator_at(i) && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x802,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, unsigned long>>>::emplace_at(size_t, Args &&...) [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>, Args = <const std::piecewise_construct_t &, std::tuple<const unsigned long &>, std::tuple<>>]"
               );
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);

        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
    }